

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

LY_ERR lys_find_path_atoms(ly_ctx *ctx,lysc_node *ctx_node,char *path,ly_bool output,ly_set **set)

{
  ly_ctx *plVar1;
  LY_ERR LVar2;
  size_t path_len;
  ly_path *path_00;
  char *pcVar3;
  lyxp_expr *expr;
  ly_path *p;
  
  expr = (lyxp_expr *)0x0;
  p = (ly_path *)0x0;
  if (ctx == (ly_ctx *)0x0 && ctx_node == (lysc_node *)0x0) {
    pcVar3 = "ctx || ctx_node";
    ctx = (ly_ctx *)0x0;
  }
  else if (path == (char *)0x0) {
    pcVar3 = "path";
  }
  else {
    if (set != (ly_set **)0x0) {
      if (ctx == (ly_ctx *)0x0 || ctx_node == (lysc_node *)0x0) {
        if (ctx == (ly_ctx *)0x0) {
          ctx = ctx_node->module->ctx;
        }
      }
      else {
        plVar1 = ctx_node->module->ctx;
        if (plVar1 != ctx && plVar1 != (ly_ctx *)0x0) {
          ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
          return LY_EINVAL;
        }
      }
      path_len = strlen(path);
      LVar2 = ly_path_parse(ctx,ctx_node,path,path_len,'\0',2,0x40,0x200,&expr);
      if (LVar2 == LY_SUCCESS) {
        LVar2 = ly_path_compile(ctx,(lys_module *)0x0,ctx_node,(lysc_ext_instance *)0x0,expr,
                                2 - (output == '\0'),0x20,'\0',LY_VALUE_JSON,(void *)0x0,&p);
        path_00 = p;
        if (LVar2 == LY_SUCCESS) {
          LVar2 = lys_find_lypath_atoms(p,set);
          path_00 = p;
        }
      }
      else {
        path_00 = (ly_path *)0x0;
      }
      ly_path_free(path_00);
      lyxp_expr_free(ctx,expr);
      return LVar2;
    }
    pcVar3 = "set";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"lys_find_path_atoms");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lys_find_path_atoms(const struct ly_ctx *ctx, const struct lysc_node *ctx_node, const char *path, ly_bool output,
        struct ly_set **set)
{
    LY_ERR ret = LY_SUCCESS;
    uint8_t oper;
    struct lyxp_expr *expr = NULL;
    struct ly_path *p = NULL;

    LY_CHECK_ARG_RET(ctx, ctx || ctx_node, path, set, LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, ctx_node ? ctx_node->module->ctx : NULL, LY_EINVAL);

    if (!ctx) {
        ctx = ctx_node->module->ctx;
    }

    /* parse */
    ret = ly_path_parse(ctx, ctx_node, path, strlen(path), 0, LY_PATH_BEGIN_EITHER, LY_PATH_PREFIX_FIRST,
            LY_PATH_PRED_SIMPLE, &expr);
    LY_CHECK_GOTO(ret, cleanup);

    /* compile */
    oper = output ? LY_PATH_OPER_OUTPUT : LY_PATH_OPER_INPUT;
    ret = ly_path_compile(ctx, NULL, ctx_node, NULL, expr, oper, LY_PATH_TARGET_MANY, 0, LY_VALUE_JSON, NULL, &p);
    LY_CHECK_GOTO(ret, cleanup);

    /* resolve */
    ret = lys_find_lypath_atoms(p, set);

cleanup:
    ly_path_free(p);
    lyxp_expr_free(ctx, expr);
    return ret;
}